

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int128.cc
# Opt level: O0

ostream * __thiscall absl::operator<<(absl *this,ostream *os,uint128 v)

{
  uint128 lhs;
  char cVar1;
  char cVar2;
  fmtflags __a;
  _Ios_Fmtflags _Var3;
  ulong uVar4;
  ulong uVar5;
  ostream *poVar6;
  uint128 v_00;
  bool local_c1;
  uint128 local_98;
  ostream *local_88;
  uint64_t uStack_80;
  _Ios_Fmtflags local_70;
  fmtflags adjustfield;
  ulong local_60;
  streamsize width;
  uint64_t uStack_50;
  string local_48 [8];
  string rep;
  fmtflags flags;
  ostream *os_local;
  uint128 v_local;
  
  __a = std::ios_base::flags((ios_base *)(this + *(long *)(*(long *)this + -0x18)));
  v_00.hi_ = (uint64_t)os;
  v_00.lo_ = (uint64_t)local_48;
  width = (streamsize)os;
  uStack_50 = v.lo_;
  (anonymous_namespace)::Uint128ToFormattedString_abi_cxx11_(v_00,(fmtflags)v.lo_);
  uVar4 = std::ios_base::width((ios_base *)(this + *(long *)(*(long *)this + -0x18)),0);
  local_60 = uVar4;
  uVar5 = std::__cxx11::string::size();
  if (uVar5 < uVar4) {
    local_70 = std::operator&(__a,_S_adjustfield);
    uVar4 = local_60;
    if (local_70 == _S_left) {
      cVar1 = std::__cxx11::string::size();
      std::ios::fill();
      std::__cxx11::string::append((ulong)local_48,(char)uVar4 - cVar1);
    }
    else {
      local_c1 = false;
      if (local_70 == _S_internal) {
        _Var3 = std::operator&(__a,_S_showbase);
        local_c1 = false;
        if (_Var3 != ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max)) {
          _Var3 = std::operator&(__a,_S_basefield);
          local_c1 = false;
          if (_Var3 == _S_hex) {
            local_88 = os;
            uStack_80 = v.lo_;
            uint128::uint128(&local_98,0);
            lhs.hi_ = uStack_80;
            lhs.lo_ = (uint64_t)local_88;
            local_c1 = operator!=(lhs,local_98);
          }
        }
      }
      cVar1 = (char)local_60;
      if (local_c1 == false) {
        cVar2 = std::__cxx11::string::size();
        std::ios::fill();
        std::__cxx11::string::insert((ulong)local_48,0,cVar1 - cVar2);
      }
      else {
        cVar2 = std::__cxx11::string::size();
        std::ios::fill();
        std::__cxx11::string::insert((ulong)local_48,2,cVar1 - cVar2);
      }
    }
  }
  poVar6 = std::operator<<((ostream *)this,local_48);
  std::__cxx11::string::~string(local_48);
  return poVar6;
}

Assistant:

std::ostream& operator<<(std::ostream& os, uint128 v) {
  std::ios_base::fmtflags flags = os.flags();
  std::string rep = Uint128ToFormattedString(v, flags);

  // Add the requisite padding.
  std::streamsize width = os.width(0);
  if (static_cast<size_t>(width) > rep.size()) {
    std::ios::fmtflags adjustfield = flags & std::ios::adjustfield;
    if (adjustfield == std::ios::left) {
      rep.append(width - rep.size(), os.fill());
    } else if (adjustfield == std::ios::internal &&
               (flags & std::ios::showbase) &&
               (flags & std::ios::basefield) == std::ios::hex && v != 0) {
      rep.insert(2, width - rep.size(), os.fill());
    } else {
      rep.insert(0, width - rep.size(), os.fill());
    }
  }

  return os << rep;
}